

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int nonce_function_test_retry
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  int __c;
  uchar *in_RDI;
  uint in_R9D;
  uint in_stack_000000cc;
  void *in_stack_000000d0;
  uchar *in_stack_000000d8;
  uchar *in_stack_000000e0;
  uchar *in_stack_000000e8;
  uchar *in_stack_000000f0;
  int local_4;
  
  if (in_R9D < 3) {
    __c = 0xff;
    if (in_R9D == 0) {
      __c = 0;
    }
    memset(in_RDI,__c,0x20);
    if (in_R9D == 2) {
      in_RDI[0x1f] = in_RDI[0x1f] + 0xff;
    }
    local_4 = 1;
  }
  else if (in_R9D < 5) {
    in_RDI[0] = 0xff;
    in_RDI[1] = 0xff;
    in_RDI[2] = 0xff;
    in_RDI[3] = 0xff;
    in_RDI[4] = 0xff;
    in_RDI[5] = 0xff;
    in_RDI[6] = 0xff;
    in_RDI[7] = 0xff;
    in_RDI[8] = 0xff;
    in_RDI[9] = 0xff;
    in_RDI[10] = 0xff;
    in_RDI[0xb] = 0xff;
    in_RDI[0xc] = 0xff;
    in_RDI[0xd] = 0xff;
    in_RDI[0xe] = 0xff;
    in_RDI[0xf] = 0xfe;
    in_RDI[0x10] = 0xba;
    in_RDI[0x11] = 0xae;
    in_RDI[0x12] = 0xdc;
    in_RDI[0x13] = 0xe6;
    in_RDI[0x14] = 0xaf;
    in_RDI[0x15] = 'H';
    in_RDI[0x16] = 0xa0;
    in_RDI[0x17] = ';';
    in_RDI[0x18] = 0xbf;
    in_RDI[0x19] = 0xd2;
    in_RDI[0x1a] = '^';
    in_RDI[0x1b] = 0x8c;
    in_RDI[0x1c] = 0xd0;
    in_RDI[0x1d] = '6';
    in_RDI[0x1e] = 'A';
    in_RDI[0x1f] = 'A';
    if (in_R9D == 4) {
      in_RDI[0x1f] = in_RDI[0x1f] + '\x01';
    }
    local_4 = 1;
  }
  else if (in_R9D < 6) {
    local_4 = nonce_function_rfc6979
                        (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                         in_stack_000000d0,in_stack_000000cc);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int nonce_function_test_retry(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   /* Dummy nonce generator that produces unacceptable nonces for the first several counter values. */
   if (counter < 3) {
       memset(nonce32, counter==0 ? 0 : 255, 32);
       if (counter == 2) {
           nonce32[31]--;
       }
       return 1;
   }
   if (counter < 5) {
       static const unsigned char order[] = {
           0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
           0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
           0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
           0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x41
       };
       memcpy(nonce32, order, 32);
       if (counter == 4) {
           nonce32[31]++;
       }
       return 1;
   }
   /* Retry rate of 6979 is negligible esp. as we only call this in deterministic tests. */
   /* If someone does fine a case where it retries for secp256k1, we'd like to know. */
   if (counter > 5) {
       return 0;
   }
   return nonce_function_rfc6979(nonce32, msg32, key32, algo16, data, counter - 5);
}